

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O3

JL_STATUS JlParseJsonEx(char *JsonString,_Bool IsJson5,JlDataObject **pRootObject,
                       size_t *pErrorAtPos)

{
  ParseStack *pPVar1;
  _Bool _Var2;
  byte bVar3;
  bool bVar4;
  int32_t iVar5;
  size_t sVar6;
  _Bool IsBareWord;
  JL_STATUS JVar7;
  int iVar8;
  JL_STATUS JVar9;
  size_t JsonStringLength;
  JL_STATUS JVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  byte bVar17;
  bool bVar18;
  byte bVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  char *pcVar23;
  char **ppcVar24;
  ParseStack *pPVar25;
  JL_DATA_TYPE newType;
  size_t newStringIndex;
  char *local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  ParseParameters local_88;
  size_t *local_58;
  uint local_4c;
  char *local_48;
  JlDataObject **local_40;
  JL_DATA_TYPE local_34;
  
  if (pRootObject == (JlDataObject **)0x0 || JsonString == (char *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  local_88.StackIndex = 0;
  local_88._12_4_ = 0;
  local_88.JsonStringLength = 0;
  local_88.StringIndex = 0;
  local_88.IsJson5 = false;
  local_88._41_7_ = 0;
  local_88.JsonString = JsonString;
  local_40 = pRootObject;
  local_88.JsonStringLength = strlen(JsonString);
  local_88.IsJson5 = IsJson5;
  local_88.Stack = (ParseStack *)WjTestLib_Calloc(0xa50,1);
  if (pErrorAtPos != (size_t *)0x0) {
    *pErrorAtPos = 0;
  }
  if (local_88.Stack == (ParseStack *)0x0) {
    JVar7 = JL_STATUS_OUT_OF_MEMORY;
    local_a8 = (char *)0x0;
    goto LAB_00103ce7;
  }
  local_88.StackIndex = 0;
  (local_88.Stack)->Type = JL_DATA_TYPE_NONE;
  (local_88.Stack)->ScanForSubObjects = true;
  local_4c = (uint)IsJson5;
  local_a8 = (char *)0x0;
  local_58 = pErrorAtPos;
  local_48 = JsonString;
  do {
    sVar6 = local_88.StringIndex;
    pcVar23 = local_88.JsonString;
    iVar5 = local_88.StackIndex;
    pPVar1 = local_88.Stack;
    uVar15 = (ulong)(uint)local_88.StackIndex;
    pPVar25 = local_88.Stack + uVar15;
    if (pPVar25->FinishedProcessing != false) {
      JVar7 = JL_STATUS_SUCCESS;
      if (uVar15 != 0) {
        if (pPVar25[-1].Type == JL_DATA_TYPE_DICTIONARY) {
          JVar7 = JlAttachObjectToDictionaryObject
                            (pPVar25[-1].Object,pPVar25[-1].CurrentKeyName,pPVar25->Object);
          if ((pErrorAtPos != (size_t *)0x0) && (JVar7 != JL_STATUS_SUCCESS)) {
            *pErrorAtPos = pPVar25[-1].CurrentKeyStringIndex;
          }
          WjTestLib_Free(pPVar25[-1].CurrentKeyName);
          pPVar25[-1].CurrentKeyName = (char *)0x0;
        }
        else {
          JVar7 = JL_STATUS_SUCCESS;
          if (pPVar25[-1].Type == JL_DATA_TYPE_LIST) {
            JVar7 = JlAttachObjectToListObject(pPVar25[-1].Object,pPVar25->Object);
          }
        }
      }
      local_88.StackIndex = iVar5 - 1;
      goto switchD_0010322f_default;
    }
    local_a8 = (char *)local_88.StringIndex;
    if (pPVar25->ScanForSubObjects == true) {
      if (pPVar25->Type == JL_DATA_TYPE_NONE) {
        pPVar25->FinishedProcessing = true;
      }
      pPVar25->ScanForSubObjects = false;
      local_98 = local_98 & 0xffffffff00000000;
      JVar7 = DetectNewType(local_88.JsonString,local_88.JsonStringLength,local_88.StringIndex,
                            SUB41(local_4c,0),(size_t *)&local_90,(JL_DATA_TYPE *)&local_98,
                            pErrorAtPos);
      if (((JL_DATA_TYPE)local_98 != JL_DATA_TYPE_NONE && JVar7 == JL_STATUS_SUCCESS) &&
         (JVar7 = JL_STATUS_JSON_NESTING_TOO_DEEP, (uint)iVar5 < 0x41)) {
        local_88.StringIndex = (size_t)local_90;
        local_88.StackIndex = iVar5 + 1;
        pPVar1 = pPVar1 + (uint)local_88.StackIndex;
        *(undefined8 *)pPVar1 = 0;
        pPVar1->Object = (JlDataObject *)0x0;
        pPVar1->FinishedProcessing = false;
        pPVar1->ProcessedFirstItem = false;
        pPVar1->ScanForSubObjects = false;
        pPVar1->PrevScanComma = false;
        pPVar1->DictionaryScanState = DICT_SCAN_STATE_NONE;
        pPVar1->CurrentKeyName = (char *)0x0;
        pPVar1->CurrentKeyStringIndex = 0;
        pPVar1->Type = (JL_DATA_TYPE)local_98;
        JVar7 = JlCreateObjectWithTag((JL_DATA_TYPE)local_98,(size_t)local_90,&pPVar1->Object);
      }
      goto switchD_0010322f_default;
    }
    JVar7 = JL_STATUS_SUCCESS;
    _Var2 = local_88.IsJson5;
    switch(pPVar25->Type) {
    case JL_DATA_TYPE_STRING:
      local_90 = (char *)0x0;
      local_98 = 0;
      if ((local_88.JsonStringLength - local_88.StringIndex < 4) ||
         (*(int *)(local_88.JsonString + local_88.StringIndex) != 0x6c6c756e)) {
        JVar7 = ParseString(local_88.JsonString + local_88.StringIndex,
                            local_88.JsonStringLength - local_88.StringIndex,false,local_88.IsJson5,
                            &local_98,&local_90);
        pcVar23 = local_90;
        if (JVar7 == JL_STATUS_SUCCESS) {
          local_88.StringIndex = sVar6 + local_98;
          pPVar1[uVar15].FinishedProcessing = true;
          JVar7 = JlSetObjectString(pPVar1[uVar15].Object,local_90);
          WjTestLib_Free(pcVar23);
          if (JVar7 == JL_STATUS_SUCCESS) goto LAB_00103ba6;
        }
        else if (local_98 != 0 && pErrorAtPos != (size_t *)0x0) {
          *pErrorAtPos = (size_t)(sVar6 + local_98);
        }
        JlFreeObjectTree(&pPVar1[uVar15].Object);
        break;
      }
      local_88.Stack[uVar15].FinishedProcessing = true;
      local_88.StringIndex = local_88.StringIndex + 4;
      goto LAB_00103ba6;
    case JL_DATA_TYPE_NUMBER:
      local_a0 = local_88.JsonString + local_88.StringIndex;
      uVar15 = local_88.JsonStringLength - local_88.StringIndex;
      if (local_88.IsJson5 == true) {
        if (uVar15 < 4) {
          if (uVar15 == 0) goto LAB_00103808;
          if (uVar15 == 3) {
            iVar8 = strncasecmp(local_a0,"inf",3);
            bVar16 = true;
            if ((iVar8 == 0) || (iVar8 = strncasecmp(local_a0,"nan",3), iVar8 == 0)) {
              bVar4 = false;
              uVar12 = 0;
              JVar10 = JL_STATUS_SUCCESS;
              uVar15 = 3;
              goto LAB_0010380a;
            }
          }
        }
        else {
          iVar8 = strncasecmp(local_a0,"+inf",4);
          bVar16 = true;
          if ((iVar8 == 0) || (iVar8 = strncasecmp(local_a0,"-inf",4), iVar8 == 0)) {
            bVar4 = false;
            uVar12 = 0;
            JVar10 = JL_STATUS_SUCCESS;
            uVar15 = 4;
            goto LAB_0010380a;
          }
        }
LAB_00103616:
        pcVar23 = pcVar23 + sVar6;
        bVar4 = false;
        uVar20 = 0;
        uVar12 = 0;
        do {
          uVar11 = uVar20;
          bVar19 = pcVar23[uVar11];
          bVar16 = bVar4;
          if (9 < (byte)(bVar19 - 0x30)) {
            JVar10 = JL_STATUS_SUCCESS;
            JVar9 = JL_STATUS_SUCCESS;
            uVar20 = (ulong)(bVar19 - 9);
            uVar22 = (uint)bVar19;
            if (bVar19 - 9 < 0x3d) {
              if ((0x1000003400000000U >> (uVar20 & 0x3f) & 1) == 0) {
                if (uVar20 != 2) {
                  if ((0x800013UL >> (uVar20 & 0x3f) & 1) == 0) goto LAB_0010369a;
                  goto LAB_001037ab;
                }
                if (_Var2 != false) goto LAB_001037ab;
LAB_00103740:
                JVar10 = JL_STATUS_INVALID_DATA;
                if (((!bVar4) || (0x25 < uVar22 - 0x41)) ||
                   (bVar16 = bVar4, (0x3f0000003fU >> ((ulong)(uVar22 - 0x41) & 0x3f) & 1) == 0))
                goto LAB_001037ab;
              }
            }
            else {
LAB_0010369a:
              if (bVar19 != 0x65) {
                if (((((bVar19 == 0xc & _Var2) != 0) || (bVar19 == 0x2c)) ||
                    (JVar10 = JVar9, bVar19 == 0x5d)) || (bVar19 == 0x7d)) goto LAB_001037ab;
                if (bVar19 == 0xc2 && _Var2 == true) {
                  if (pcVar23[uVar11 + 1] == -0x60) goto LAB_001037ab;
                }
                else {
                  if (_Var2 == false) goto LAB_00103740;
                  if (uVar22 != 0xe2) {
                    if (uVar22 == 0xef) {
                      if ((pcVar23[uVar11 + 1] == -0x45) && (pcVar23[uVar11 + 2] == -0x41))
                      goto LAB_001037ab;
                    }
                    else if (uVar22 == 0x2f) goto LAB_001037ab;
                  }
                }
                if (((uVar11 != 1) || (*local_a0 != '0')) ||
                   (bVar16 = true, (byte)(local_a0[1] | 0x20U) != 0x78)) goto LAB_00103740;
              }
            }
          }
          bVar4 = bVar16;
          uVar20 = uVar11 + 1;
          uVar12 = uVar11;
        } while (uVar15 != uVar11 + 1);
        uVar12 = uVar15 - 1;
        JVar10 = JL_STATUS_SUCCESS;
LAB_001037ab:
        bVar16 = false;
        uVar15 = 0;
      }
      else {
        if (local_88.JsonStringLength != local_88.StringIndex) goto LAB_00103616;
LAB_00103808:
        uVar12 = 0;
        JVar10 = JL_STATUS_SUCCESS;
        bVar16 = false;
        bVar4 = false;
        uVar15 = uVar12;
      }
LAB_0010380a:
      JVar9 = JVar10;
      if (0x11 < uVar12) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (uVar12 == 1) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (!bVar4) {
        JVar9 = JVar10;
      }
      if ((JVar9 == JL_STATUS_SUCCESS && _Var2 == false) &&
         (JVar9 = JL_STATUS_SUCCESS, local_a0[uVar12] == '.')) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (bVar16 || JVar9 != JL_STATUS_SUCCESS) {
        if (JVar9 == JL_STATUS_SUCCESS) goto LAB_001039bd;
      }
      else {
        uVar15 = uVar12 + 1;
        if (uVar15 == 0) {
          uVar15 = 0;
        }
        else {
          bVar18 = true;
          uVar12 = 0;
          bVar17 = 0;
          bVar13 = 0;
          bVar16 = false;
          bVar19 = _Var2;
          bVar21 = _Var2;
          do {
            if (bVar4) {
              if ((1 < uVar12) && (9 < (byte)(local_a0[uVar12] - 0x30U))) {
                JVar9 = JL_STATUS_INVALID_DATA;
                uVar22 = (byte)local_a0[uVar12] - 0x41;
                if ((0x25 < uVar22) || ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0))
                goto LAB_00103c7b;
              }
            }
            else {
              bVar3 = local_a0[uVar12];
              if ((byte)(bVar3 - 0x30) < 10) {
                bVar21 = (bVar13 | bVar17) ^ 1 | bVar21;
                if (bVar17 == 0) {
                  bVar16 = true;
                }
                bVar18 = false;
                bVar19 = 0;
              }
              else {
                JVar9 = JL_STATUS_INVALID_DATA;
                if (bVar3 < 0x2e) {
                  if (bVar3 == 0x2b) {
                    if ((bVar19 & 1) == 0) goto LAB_00103c7b;
                  }
                  else if ((bVar3 != 0x2d) || (!bVar18)) goto LAB_00103c7b;
                  bVar21 = bVar21 | (bVar13 | bVar17) ^ 1;
                  if (bVar17 == 0) {
                    bVar16 = true;
                  }
                  bVar18 = false;
                  bVar19 = 0;
                }
                else if (bVar3 == 0x2e) {
                  if ((bVar21 & 1) == 0) goto LAB_00103c7b;
                  bVar13 = 1;
                  bVar16 = false;
                  bVar21 = 0;
                }
                else {
                  if (((bVar3 != 0x45) && (bVar3 != 0x65)) || (!bVar16)) goto LAB_00103c7b;
                  bVar18 = true;
                  bVar16 = false;
                  bVar19 = 1;
                  bVar21 = 0;
                  bVar17 = 1;
                }
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
LAB_001039bd:
        if ((_Var2 == false) || (*local_a0 != '+')) {
          lVar14 = 0;
        }
        else {
          local_a0 = local_a0 + 1;
          uVar15 = uVar15 - 1;
          lVar14 = 1;
        }
        pcVar23 = (char *)WjTestLib_Calloc(uVar15 + 1,1);
        if (pcVar23 == (char *)0x0) {
          JVar9 = JL_STATUS_OUT_OF_MEMORY;
        }
        else {
          memcpy(pcVar23,local_a0,uVar15);
          local_88.StringIndex = sVar6 + lVar14 + uVar15;
          pPVar1[iVar5].FinishedProcessing = true;
          JVar9 = JlSetObjectNumberString(pPVar1[iVar5].Object,pcVar23);
          WjTestLib_Free(pcVar23);
          pErrorAtPos = local_58;
          if (JVar9 == JL_STATUS_SUCCESS) break;
        }
      }
LAB_00103c7b:
      uVar15 = (ulong)iVar5;
      goto LAB_00103c7e;
    case JL_DATA_TYPE_BOOL:
      JVar9 = JL_STATUS_INVALID_DATA;
      if (3 < local_88.JsonStringLength - local_88.StringIndex) {
        iVar8 = *(int *)(local_88.JsonString + local_88.StringIndex);
        if (iVar8 == 0x65757274) {
          lVar14 = 4;
        }
        else if ((local_88.JsonStringLength - local_88.StringIndex == 4) ||
                (lVar14 = 5,
                (local_88.JsonString + 4)[local_88.StringIndex] != 'e' ||
                *(int *)(local_88.JsonString + local_88.StringIndex) != 0x736c6166))
        goto LAB_00103c7e;
        local_88.StringIndex = local_88.StringIndex + lVar14;
        local_88.Stack[uVar15].FinishedProcessing = true;
        JVar9 = JlSetObjectBool(local_88.Stack[uVar15].Object,iVar8 == 0x65757274);
        pErrorAtPos = local_58;
        if (JVar9 == JL_STATUS_SUCCESS) break;
      }
LAB_00103c7e:
      JVar7 = JVar9;
      JlFreeObjectTree(&pPVar1[uVar15].Object);
      pErrorAtPos = local_58;
      goto LAB_00103c9b;
    case JL_DATA_TYPE_LIST:
      _Var2 = pPVar25->ProcessedFirstItem;
      if (_Var2 == false) {
        local_88.StringIndex = local_88.StringIndex + 1;
      }
      JVar7 = SkipWhiteSpace(&local_88,(char *)&local_90);
      if (JVar7 == JL_STATUS_SUCCESS) {
        if (pPVar25->PrevScanComma == false) {
          if ((char)local_90 == ',') {
            JVar7 = JL_STATUS_INVALID_DATA;
            if (_Var2 == false) goto LAB_00103ae4;
            local_88.StringIndex = local_88.StringIndex + 1;
            pPVar25->PrevScanComma = true;
          }
          else if ((char)local_90 == ']') {
LAB_001037cc:
            pPVar25->FinishedProcessing = true;
            local_88.StringIndex = local_88.StringIndex + 1;
          }
          else {
            JVar7 = JL_STATUS_INVALID_DATA;
            if (_Var2 != false) goto LAB_00103ae4;
            pPVar25->ScanForSubObjects = true;
          }
LAB_00103ae1:
          JVar7 = JL_STATUS_SUCCESS;
        }
        else {
          JVar7 = JL_STATUS_INVALID_DATA;
          if ((char)local_90 != ',') {
            if ((char)local_90 != ']') {
              pPVar25->ScanForSubObjects = true;
              pPVar25->PrevScanComma = false;
              goto LAB_00103ae1;
            }
            if (local_88.IsJson5 == true) goto LAB_001037cc;
          }
        }
LAB_00103ae4:
        pPVar25->ProcessedFirstItem = true;
      }
      if (JVar7 != JL_STATUS_SUCCESS && pErrorAtPos != (size_t *)0x0) {
LAB_00103afd:
        if (*pErrorAtPos == 0) {
          *pErrorAtPos = local_88.StringIndex;
        }
      }
      break;
    case JL_DATA_TYPE_DICTIONARY:
      _Var2 = pPVar25->ProcessedFirstItem;
      if (_Var2 == false) {
        local_88.StringIndex = local_88.StringIndex + 1;
        pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
      }
      JVar7 = SkipWhiteSpace(&local_88,(char *)&local_98);
      sVar6 = local_88.StringIndex;
      pPVar1 = local_88.Stack;
      if (JVar7 != JL_STATUS_SUCCESS) break;
      switch(pPVar25->DictionaryScanState) {
      case DICT_SCAN_STATE_NEED_KEY:
        if (((undefined1)local_98 == 0x22) ||
           (((undefined1)local_98 == 0x27 & local_88.IsJson5) != 0)) {
          IsBareWord = false;
        }
        else if ((local_88.IsJson5 == false) ||
                (((IsBareWord = true, (undefined1)local_98 != 0x24 && ((undefined1)local_98 != 0x5f)
                  ) && (0x19 < (byte)(((undefined1)local_98 & 0xdf) + 0xbf))))) {
          JVar7 = JL_STATUS_INVALID_DATA;
          if (((undefined1)local_98 == 0x7d) && (_Var2 != true || local_88.IsJson5 != false))
          goto LAB_00103b8f;
          goto LAB_00103bae;
        }
        local_90 = (char *)0x0;
        lVar14 = (long)local_88.StackIndex;
        JVar7 = ParseString(local_88.JsonString + local_88.StringIndex,
                            local_88.JsonStringLength - local_88.StringIndex,IsBareWord,false,
                            (size_t *)&local_90,&local_88.Stack[lVar14].CurrentKeyName);
        pErrorAtPos = local_58;
        if (JVar7 != JL_STATUS_SUCCESS) {
          pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
LAB_00103bae:
          if (pPVar25->CurrentKeyName != (char *)0x0) {
            WjTestLib_Free(pPVar25->CurrentKeyName);
            pPVar25->CurrentKeyName = (char *)0x0;
          }
          pPVar25->ProcessedFirstItem = true;
          if (pErrorAtPos != (size_t *)0x0) goto LAB_00103afd;
          goto switchD_0010322f_default;
        }
        pPVar1[lVar14].CurrentKeyStringIndex = sVar6;
        local_88.StringIndex = sVar6 + (long)local_90;
        pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
        break;
      case DICT_SCAN_STATE_NEED_COLON:
        JVar7 = JL_STATUS_INVALID_DATA;
        if ((undefined1)local_98 != 0x3a) goto LAB_00103bae;
        pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_VALUE;
        pPVar25->ScanForSubObjects = true;
        goto LAB_00103b9c;
      case DICT_SCAN_STATE_NEED_VALUE:
        pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_COMMA_OR_END;
        pPVar25->ScanForSubObjects = false;
        break;
      case DICT_SCAN_STATE_NEED_COMMA_OR_END:
        if ((undefined1)local_98 == 0x7d) {
LAB_00103b8f:
          pPVar25->FinishedProcessing = true;
          pPVar25->DictionaryScanState = DICT_SCAN_STATE_NONE;
        }
        else {
          JVar7 = JL_STATUS_INVALID_DATA;
          if ((undefined1)local_98 != 0x2c) goto LAB_00103bae;
          pPVar25->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
        }
LAB_00103b9c:
        local_88.StringIndex = local_88.StringIndex + 1;
      }
      pPVar25->ProcessedFirstItem = true;
LAB_00103ba6:
      JVar7 = JL_STATUS_SUCCESS;
    }
switchD_0010322f_default:
    sVar6 = local_88.StringIndex;
  } while ((-1 < local_88.StackIndex) && (JVar7 == JL_STATUS_SUCCESS));
  if (JVar7 == JL_STATUS_SUCCESS) {
    pcVar23 = local_48 + local_88.StringIndex;
    JsonStringLength = strlen(pcVar23);
    JVar7 = JL_STATUS_SUCCESS;
    JVar9 = DetectNewType(pcVar23,JsonStringLength,0,SUB41(local_4c,0),(size_t *)&local_90,&local_34
                          ,&local_98);
    if (JVar9 == JL_STATUS_SUCCESS) {
      local_88.StackIndex = 1;
      if (pErrorAtPos != (size_t *)0x0) {
        *pErrorAtPos = sVar6;
      }
      JVar7 = JL_STATUS_INVALID_DATA;
LAB_00103ca4:
      pPVar25 = local_88.Stack;
      lVar14 = (ulong)(uint)local_88.StackIndex + 1;
      ppcVar24 = &local_88.Stack[(uint)local_88.StackIndex].CurrentKeyName;
      do {
        JlFreeObjectTree((JlDataObject **)(ppcVar24 + -2));
        if (*ppcVar24 != (char *)0x0) {
          WjTestLib_Free(*ppcVar24);
          *ppcVar24 = (char *)0x0;
        }
        lVar14 = lVar14 + -1;
        ppcVar24 = ppcVar24 + -5;
      } while (1 < lVar14);
    }
    else {
      *local_40 = local_88.Stack[1].Object;
      pPVar25 = local_88.Stack;
    }
  }
  else {
LAB_00103c9b:
    pPVar25 = local_88.Stack;
    if (0 < local_88.StackIndex) goto LAB_00103ca4;
  }
  WjTestLib_Free(pPVar25);
LAB_00103ce7:
  if (((pErrorAtPos != (size_t *)0x0) && (JVar7 != JL_STATUS_SUCCESS)) && (*pErrorAtPos == 0)) {
    *pErrorAtPos = (size_t)local_a8;
  }
  return JVar7;
}

Assistant:

JL_STATUS
    JlParseJsonEx
    (
        char const*     JsonString,
        bool            IsJson5,
        JlDataObject**  pRootObject,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != pRootObject )
    {
        size_t prevStringIndex = 0;
        ParseParameters params = { 0 };
        params.JsonString = JsonString;
        params.JsonStringLength = strlen( JsonString );
        params.StringIndex = 0;
        params.IsJson5 = IsJson5;
        // Stack is allocated 2 more because we don't use the first element and we need an extra one to contain the last list
        // or dictionary nest levels items.
        params.Stack = JlAlloc( sizeof(ParseStack) * (MAX_JSON_DEPTH+2) );

        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = 0;
        }

        if( NULL != params.Stack )
        {
            // Setup first item in stack as the "none" type (for whitespace). When this is popped off we
            // will have finished.
            params.StackIndex = 0;
            params.Stack[0].Type = JL_DATA_TYPE_NONE;
            params.Stack[0].ScanForSubObjects = true;

            jlStatus = JL_STATUS_SUCCESS;
            while( params.StackIndex >= 0  &&  JL_STATUS_SUCCESS == jlStatus )
            {
                ParseStack* stackItem = &params.Stack[params.StackIndex];

                if( ! stackItem->FinishedProcessing )
                {
                    prevStringIndex = params.StringIndex;
                    if( params.Stack[params.StackIndex].ScanForSubObjects )
                    {
                        if( JL_DATA_TYPE_NONE == params.Stack[params.StackIndex].Type )
                        {
                            // Note we must mark it finished first because ParseForNewType will adjust StackIndex
                            stackItem->FinishedProcessing = true;
                            stackItem->ScanForSubObjects = false;
                        }
                        // Turn off scanning for sub objects as we will need to go back to list or dictionary
                        // processing between objects
                        stackItem->ScanForSubObjects = false;

                        jlStatus = ParseForNewType( &params, IsJson5, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_STRING == stackItem->Type )
                    {
                        jlStatus = ParseForString( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_NUMBER == stackItem->Type )
                    {
                        jlStatus = ParseForNumber( &params );
                    }
                    else if( JL_DATA_TYPE_BOOL == stackItem->Type )
                    {
                        jlStatus = ParseForBool( &params );
                    }
                    else if( JL_DATA_TYPE_LIST == stackItem->Type )
                    {
                        jlStatus = ParseForList( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_DICTIONARY == stackItem->Type )
                    {
                        jlStatus = ParseForDictionary( &params, pErrorAtPos );
                    }

                }
                else
                {
                    // Attempt to attach this object to previous level (if its a list or dictionary)
                    jlStatus = AttachStackObjectToPreviousObject( params.Stack, params.StackIndex, pErrorAtPos );
                    // Finished with this level. So pop off the stack
                    params.StackIndex -= 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Verify that there is nothing but white space after the final object.
                jlStatus = VerifyOnlyTrailingWhiteSpace( JsonString + params.StringIndex, IsJson5 );
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    // At this point we have a full object tree created, but the params are now
                    // reset. So modify index so it will remove the full tree (at index 1)
                    params.StackIndex = 1;

                    if( NULL != pErrorAtPos )
                    {
                        *pErrorAtPos = params.StringIndex;
                    }
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Get root object (in index position 1)
                *pRootObject = params.Stack[1].Object;
            }
            else
            {
                // Free object tree created so far
                for( int32_t i=params.StackIndex; i>0; i-- )
                {
                    (void) JlFreeObjectTree( &params.Stack[i].Object );
                    if( NULL != params.Stack[i].CurrentKeyName )
                    {
                        JlFree( params.Stack[i].CurrentKeyName );
                        params.Stack[i].CurrentKeyName = NULL;
                    }
                }
            }

            JlFree( params.Stack );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // If optional parameter was provided, then set the position of the error in the string.
            if(     NULL != pErrorAtPos
                &&  0 == *pErrorAtPos )
            {
                *pErrorAtPos = prevStringIndex;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}